

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int32 pare_tree(node *sroot,int32 npermute,int32 **lists,int32 *llist)

{
  int32 iVar1;
  node **idlist_00;
  void *ptr;
  int *ptr_00;
  float *ptr_01;
  node **idlist;
  int32 maxid;
  int32 i;
  int32 nnodes;
  int32 ntwigs;
  int32 *twiglist;
  int32 nleaves;
  int32 *leaflist;
  float32 maxdec;
  float32 *twiglkhddec;
  int32 *llist_local;
  int32 **lists_local;
  int32 npermute_local;
  node *sroot_local;
  
  idlist_00 = (node **)__ckd_calloc__(0x400,8,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                      ,0x20e);
  iVar1 = id_nodes(sroot,idlist_00,0);
  ptr = __ckd_calloc__((long)iVar1,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                       ,0x213);
  ptr_00 = (int *)__ckd_calloc__((long)iVar1,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                 ,0x214);
  ptr_01 = (float *)__ckd_calloc__((long)iVar1,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                   ,0x215);
  i = 0;
  twiglist._4_4_ = 0;
  for (idlist._4_4_ = 0; idlist._4_4_ < iVar1; idlist._4_4_ = idlist._4_4_ + 1) {
    if (((idlist_00[idlist._4_4_] == (node *)0x0) ||
        (idlist_00[idlist._4_4_]->left != (node_str *)0x0)) ||
       (idlist_00[idlist._4_4_]->right != (node_str *)0x0)) {
      if ((((idlist_00[idlist._4_4_] != (node *)0x0) &&
           (idlist_00[idlist._4_4_]->left != (node_str *)0x0)) &&
          ((idlist_00[idlist._4_4_]->left->left == (node_str *)0x0 &&
           ((idlist_00[idlist._4_4_]->left->right == (node_str *)0x0 &&
            (idlist_00[idlist._4_4_]->right != (node_str *)0x0)))))) &&
         ((idlist_00[idlist._4_4_]->right->left == (node_str *)0x0 &&
          (idlist_00[idlist._4_4_]->right->right == (node_str *)0x0)))) {
        ptr_00[i] = idlist._4_4_;
        ptr_01[i] = (float)idlist_00[idlist._4_4_]->lkhd_dec;
        i = i + 1;
      }
    }
    else {
      *(int *)((long)ptr + (long)twiglist._4_4_ * 4) = idlist._4_4_;
      twiglist._4_4_ = twiglist._4_4_ + 1;
    }
  }
  while (npermute < twiglist._4_4_) {
    leaflist._4_4_ = *ptr_01;
    idlist._0_4_ = *ptr_00;
    for (idlist._4_4_ = 1; idlist._4_4_ < i; idlist._4_4_ = idlist._4_4_ + 1) {
      if (leaflist._4_4_ < ptr_01[idlist._4_4_]) {
        leaflist._4_4_ = ptr_01[idlist._4_4_];
        idlist._0_4_ = ptr_00[idlist._4_4_];
      }
    }
    idlist_00[idlist_00[(int)idlist]->left->id] = (node *)0x0;
    idlist_00[idlist_00[(int)idlist]->right->id] = (node *)0x0;
    free_tree(idlist_00[(int)idlist]->left);
    free_tree(idlist_00[(int)idlist]->right);
    idlist_00[(int)idlist]->right = (node_str *)0x0;
    idlist_00[(int)idlist]->left = (node_str *)0x0;
    i = 0;
    twiglist._4_4_ = 0;
    for (idlist._4_4_ = 0; idlist._4_4_ < iVar1; idlist._4_4_ = idlist._4_4_ + 1) {
      if (((idlist_00[idlist._4_4_] == (node *)0x0) ||
          (idlist_00[idlist._4_4_]->left != (node_str *)0x0)) ||
         (idlist_00[idlist._4_4_]->right != (node_str *)0x0)) {
        if ((((idlist_00[idlist._4_4_] != (node *)0x0) &&
             (idlist_00[idlist._4_4_]->left != (node_str *)0x0)) &&
            (((idlist_00[idlist._4_4_]->left->left == (node_str *)0x0 &&
              ((idlist_00[idlist._4_4_]->left->right == (node_str *)0x0 &&
               (idlist_00[idlist._4_4_]->right != (node_str *)0x0)))) &&
             (idlist_00[idlist._4_4_]->right->left == (node_str *)0x0)))) &&
           (idlist_00[idlist._4_4_]->right->right == (node_str *)0x0)) {
          ptr_00[i] = idlist._4_4_;
          ptr_01[i] = (float)idlist_00[idlist._4_4_]->lkhd_dec;
          i = i + 1;
        }
      }
      else {
        *(int *)((long)ptr + (long)twiglist._4_4_ * 4) = idlist._4_4_;
        twiglist._4_4_ = twiglist._4_4_ + 1;
      }
    }
  }
  for (idlist._4_4_ = 0; idlist._4_4_ < twiglist._4_4_; idlist._4_4_ = idlist._4_4_ + 1) {
    llist[idlist._4_4_] = idlist_00[*(int *)((long)ptr + (long)idlist._4_4_ * 4)]->nphones;
    memcpy(lists[idlist._4_4_],idlist_00[*(int *)((long)ptr + (long)idlist._4_4_ * 4)]->phoneids,
           (long)llist[idlist._4_4_] << 2);
  }
  ckd_free(idlist_00);
  ckd_free(ptr);
  ckd_free(ptr_00);
  ckd_free(ptr_01);
  return twiglist._4_4_;
}

Assistant:

int32 pare_tree(node *sroot, int32 npermute, int32 **lists, int32 *llist)
{
    float32 *twiglkhddec,maxdec;
    int32  *leaflist, nleaves, *twiglist, ntwigs;
    int32  nnodes,i,maxid;
    node   **idlist;

    /* Overallocate idlist */
    idlist = (node **) ckd_calloc(1024,sizeof(node *));
    /* First "id" all the nodes */
    nnodes = id_nodes(sroot,idlist,0);

    /* Allocate lists (overallocate for safety margin) */
    leaflist = (int32 *) ckd_calloc(nnodes,sizeof(int32));
    twiglist = (int32 *) ckd_calloc(nnodes,sizeof(int32));
    twiglkhddec = (float32 *) ckd_calloc(nnodes,sizeof(float32));

    nleaves = ntwigs = 0;
    for(i=0;i<nnodes;i++) {
        if (IS_LEAF(idlist[i])) leaflist[nleaves++] = i;
        else if (IS_TWIG(idlist[i])) {
            twiglist[ntwigs] = i;
            twiglkhddec[ntwigs++] = (idlist[i])->lkhd_dec;
        }
    }

    while (nleaves > npermute) {
        /* find twig for which likelihood decerase was maximum 
         * this is the worst merge */
        maxdec = twiglkhddec[0]; maxid = twiglist[0];
        for (i=1; i<ntwigs;i++) {
            if (twiglkhddec[i] > maxdec) {
                maxdec = twiglkhddec[i];
                maxid = twiglist[i];
            }
        }
        /* remove children of twig, make twig a leaf, eliminate if from
           the node list, and continue */
        idlist[idlist[maxid]->left->id] = NULL;
        idlist[idlist[maxid]->right->id] = NULL;
        free_tree(idlist[maxid]->left); free_tree(idlist[maxid]->right);
        idlist[maxid]->left = idlist[maxid]->right = NULL;

        nleaves = ntwigs = 0;
        for(i=0;i<nnodes;i++) {
            if (IS_LEAF(idlist[i])) leaflist[nleaves++] = i;
            else if (IS_TWIG(idlist[i])) {
                twiglist[ntwigs] = i;
                twiglkhddec[ntwigs++] = (idlist[i])->lkhd_dec;
            }
        }
    }
    for (i=0;i<nleaves;i++) {
        llist[i] = idlist[leaflist[i]]->nphones;
        memcpy(lists[i],idlist[leaflist[i]]->phoneids,sizeof(int32)*llist[i]);
    }
    ckd_free(idlist); ckd_free(leaflist);
    ckd_free(twiglist); ckd_free(twiglkhddec);

    return(nleaves);
}